

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libskiwi.cpp
# Opt level: O0

string * skiwi::skiwi_expand(string *__return_storage_ptr__,string *scheme_expression)

{
  runtime_error *this;
  string local_370;
  undefined1 local_34c [8];
  format_options format_ops;
  stringstream ss;
  ostream local_330 [376];
  undefined1 local_1b8 [8];
  cinput_data cinput;
  logic_error e;
  runtime_error e_1;
  Program local_170;
  token *local_110;
  __normal_iterator<skiwi::token_*,_std::vector<skiwi::token,_std::allocator<skiwi::token>_>_>
  local_108;
  undefined1 local_100 [8];
  vector<skiwi::token,_std::allocator<skiwi::token>_> tokens;
  Program prog;
  repl_data rd_copy;
  shared_ptr<skiwi::environment<skiwi::environment_entry>_> env_copy;
  string *scheme_expression_local;
  
  if (((anonymous_namespace)::cd[0] & 1) == 0) {
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this,"Skiwi is not initialized");
    __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  make_deep_copy<skiwi::environment_entry>
            ((skiwi *)&rd_copy.global_index,
             (shared_ptr<skiwi::environment<skiwi::environment_entry>_> *)
             ((anonymous_namespace)::cd + 0x220));
  make_deep_copy((repl_data *)&prog.quasiquotes_converted,
                 (repl_data *)((anonymous_namespace)::cd + 0x188));
  Program::Program((Program *)
                   &tokens.super__Vector_base<skiwi::token,_std::allocator<skiwi::token>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
  tokenize((vector<skiwi::token,_std::allocator<skiwi::token>_> *)local_100,scheme_expression);
  local_108._M_current =
       (token *)std::vector<skiwi::token,_std::allocator<skiwi::token>_>::begin
                          ((vector<skiwi::token,_std::allocator<skiwi::token>_> *)local_100);
  local_110 = (token *)std::vector<skiwi::token,_std::allocator<skiwi::token>_>::end
                                 ((vector<skiwi::token,_std::allocator<skiwi::token>_> *)local_100);
  std::
  reverse<__gnu_cxx::__normal_iterator<skiwi::token*,std::vector<skiwi::token,std::allocator<skiwi::token>>>>
            (local_108,
             (__normal_iterator<skiwi::token_*,_std::vector<skiwi::token,_std::allocator<skiwi::token>_>_>
              )local_110);
  make_program(&local_170,(vector<skiwi::token,_std::allocator<skiwi::token>_> *)local_100);
  Program::operator=((Program *)
                     &tokens.super__Vector_base<skiwi::token,_std::allocator<skiwi::token>_>._M_impl
                      .super__Vector_impl_data._M_end_of_storage,&local_170);
  Program::~Program(&local_170);
  std::vector<skiwi::token,_std::allocator<skiwi::token>_>::~vector
            ((vector<skiwi::token,_std::allocator<skiwi::token>_> *)local_100);
  cinput_data::cinput_data((cinput_data *)local_1b8);
  preprocess((environment_map *)((anonymous_namespace)::cd + 0x220),
             (repl_data *)((anonymous_namespace)::cd + 0x188),
             (macro_data *)((anonymous_namespace)::cd + 0x1d8),
             (context *)((anonymous_namespace)::cd + 0x30),(cinput_data *)local_1b8,
             (Program *)
             &tokens.super__Vector_base<skiwi::token,_std::allocator<skiwi::token>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,
             (primitive_map *)((anonymous_namespace)::cd + 0x248),
             (compiler_options *)((anonymous_namespace)::cd + 4));
  std::shared_ptr<skiwi::environment<skiwi::environment_entry>_>::operator=
            ((shared_ptr<skiwi::environment<skiwi::environment_entry>_> *)
             ((anonymous_namespace)::cd + 0x220),
             (shared_ptr<skiwi::environment<skiwi::environment_entry>_> *)&rd_copy.global_index);
  repl_data::operator=
            ((repl_data *)((anonymous_namespace)::cd + 0x188),
             (repl_data *)&prog.quasiquotes_converted);
  std::__cxx11::stringstream::stringstream((stringstream *)&format_ops.max_width);
  dump(local_330,
       (Program *)
       &tokens.super__Vector_base<skiwi::token,_std::allocator<skiwi::token>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage,true);
  format_options::format_options((format_options *)local_34c);
  local_34c._0_4_ = 2;
  format_ops.indent_offset = 5;
  local_34c._4_4_ = 10;
  std::__cxx11::stringstream::str();
  format(__return_storage_ptr__,&local_370,(format_options *)local_34c);
  std::__cxx11::string::~string((string *)&local_370);
  std::__cxx11::stringstream::~stringstream((stringstream *)&format_ops.max_width);
  cinput_data::~cinput_data((cinput_data *)local_1b8);
  Program::~Program((Program *)
                    &tokens.super__Vector_base<skiwi::token,_std::allocator<skiwi::token>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage);
  repl_data::~repl_data((repl_data *)&prog.quasiquotes_converted);
  std::shared_ptr<skiwi::environment<skiwi::environment_entry>_>::~shared_ptr
            ((shared_ptr<skiwi::environment<skiwi::environment_entry>_> *)&rd_copy.global_index);
  return __return_storage_ptr__;
}

Assistant:

std::string skiwi_expand(const std::string& scheme_expression)
  {
  using namespace SKIWI;
  if (!cd.initialized)
    throw std::runtime_error("Skiwi is not initialized");
  auto env_copy = make_deep_copy(cd.env);
  auto rd_copy = make_deep_copy(cd.rd);
  Program prog;
  try
    {
    auto tokens = tokenize(scheme_expression);
    std::reverse(tokens.begin(), tokens.end());
    prog = make_program(tokens);
    }
  catch (std::logic_error e)
    {
    cd.env = env_copy;
    cd.rd = rd_copy;
    return e.what();
    }
  catch (std::runtime_error e)
    {
    cd.env = env_copy;
    cd.rd = rd_copy;
    return e.what();
    }
  cinput_data cinput;
  preprocess(cd.env, cd.rd, cd.md, cd.ctxt, cinput, prog, cd.pm, cd.ops);
  cd.env = env_copy;
  cd.rd = rd_copy;
  std::stringstream ss;
  dump(ss, prog);
  format_options format_ops;
  format_ops.indent_offset = 2;
  format_ops.min_width = 5;
  format_ops.max_width = 10;
  return format(ss.str(), format_ops);
  }